

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O1

sequence * toml::detail::syntax::array_table(sequence *__return_storage_ptr__,spec *s)

{
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  uchar local_c2 [2];
  character_either local_c0;
  key local_a0;
  either local_78;
  repeat_at_least local_58;
  literal local_40;
  
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005758b0;
  local_40.value_ = "[[";
  local_40.size_ = 2;
  local_c0.super_scanner_base._vptr_scanner_base._0_2_ = 0x920;
  cs._M_len = 2;
  cs._M_array = (iterator)&local_c0;
  character_either::character_either((character_either *)&local_a0,cs);
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00575a10;
  local_58.length_ = 0;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            (&local_58.other_,(character_either *)&local_a0);
  if (local_a0.scanner_.super_scanner_base._vptr_scanner_base != (_func_int **)0x0) {
    operator_delete(local_a0.scanner_.super_scanner_base._vptr_scanner_base,
                    (long)local_a0.scanner_.others_.
                          super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a0.scanner_.super_scanner_base._vptr_scanner_base);
  }
  local_a0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__key_00576788;
  dotted_key((sequence *)&local_c0,s);
  simple_key(&local_78,s);
  either::either<toml::detail::sequence,toml::detail::either>
            (&local_a0.scanner_,(sequence *)&local_c0,&local_78);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_78.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &local_c0.chars_);
  local_c2[0] = ' ';
  local_c2[1] = '\t';
  cs_00._M_len = 2;
  cs_00._M_array = local_c2;
  character_either::character_either(&local_c0,cs_00);
  local_78.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_00575a10;
  local_78.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner_storage::scanner_storage<toml::detail::character_either,_nullptr>
            ((scanner_storage *)
             &local_78.others_.
              super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
              ._M_impl.super__Vector_impl_data._M_finish,&local_c0);
  if (local_c0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.chars_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.chars_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005758b0;
  local_c0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "]]";
  local_c0.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2;
  sequence::
  sequence<toml::detail::literal,toml::detail::repeat_at_least,toml::detail::syntax::key,toml::detail::repeat_at_least,toml::detail::literal>
            (__return_storage_ptr__,&local_40,&local_58,&local_a0,(repeat_at_least *)&local_78,
             (literal *)&local_c0);
  if (local_78.others_.
      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (**(code **)((long)((local_78.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->scanner_)._M_t.
                       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false> + 8))();
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_a0.scanner_.others_);
  if (local_58.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_58.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence array_table(const spec& s)
{
    return sequence(literal("[["), ws(s), key(s), ws(s), literal("]]"));
}